

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::iterationReport(HighsSimplexAnalysis *this,bool header)

{
  int iVar1;
  bool bVar2;
  stringstream *this_00;
  undefined8 uVar3;
  byte in_SIL;
  HighsSimplexAnalysis *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  bool in_stack_0000000f;
  HighsSimplexAnalysis *in_stack_00000010;
  bool in_stack_0000003f;
  HighsSimplexAnalysis *in_stack_00000040;
  bool in_stack_0000004f;
  HighsSimplexAnalysis *in_stack_00000050;
  bool in_stack_0000009f;
  HighsSimplexAnalysis *in_stack_000000a0;
  pointer in_stack_ffffffffffffff98;
  string *psVar4;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  HighsLogOptions *log_options_;
  string local_48 [39];
  undefined1 in_stack_ffffffffffffffdf;
  HighsSimplexAnalysis *in_stack_ffffffffffffffe0;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
  unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffffa0,
              (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff98);
  std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  if ((in_SIL & 1) == 0) {
    bVar2 = dualAlgorithm(in_RDI);
    if (bVar2) {
      iVar1 = in_RDI->pivotal_row_index;
    }
    else {
      iVar1 = in_RDI->entering_variable;
    }
    if (iVar1 < 0) {
      return;
    }
  }
  reportAlgorithmPhase(in_stack_00000010,in_stack_0000000f);
  reportIterationObjective(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  if ((in_RDI->analyse_simplex_runtime_data & 1U) != 0) {
    reportDensity(in_stack_00000050,in_stack_0000004f);
    reportIterationData(in_stack_000000a0,in_stack_0000009f);
    reportInfeasibility(in_stack_00000040,in_stack_0000003f);
  }
  log_options_ = &in_RDI->log_options;
  std::
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator->((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x7b3193);
  psVar4 = local_48;
  std::__cxx11::stringstream::str();
  uVar3 = std::__cxx11::string::c_str();
  highsLogDev(log_options_,kVerbose,"%s\n",uVar3,in_R8,in_R9,psVar4);
  std::__cxx11::string::~string(local_48);
  if ((in_SIL & 1) == 0) {
    in_RDI->num_iteration_report_since_last_header =
         in_RDI->num_iteration_report_since_last_header + 1;
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::iterationReport(const bool header) {
  analysis_log = std::unique_ptr<std::stringstream>(new std::stringstream());
  if (!header) {
    if (dualAlgorithm()) {
      if (pivotal_row_index < 0) return;
    } else {
      if (entering_variable < 0) return;
    }
  }
  reportAlgorithmPhase(header);
  reportIterationObjective(header);
  if (analyse_simplex_runtime_data) {
    reportDensity(header);
    reportIterationData(header);
    reportInfeasibility(header);
  }
  highsLogDev(log_options, kIterationReportLogType, "%s\n",
              analysis_log->str().c_str());
  if (!header) num_iteration_report_since_last_header++;
}